

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

char * cstring_from_token(gravity_parser_t *parser,gtoken_s token)

{
  char *__src;
  char *__dest;
  uint32_t len;
  
  len = 0;
  __src = token_string(token,&len);
  __dest = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(len + 1));
  memcpy(__dest,__src,(ulong)len);
  return __dest;
}

Assistant:

static char *cstring_from_token (gravity_parser_t *parser, gtoken_s token) {
    #pragma unused(parser)
    uint32_t len = 0;
    const char *buffer = token_string(token, &len);

    char *str = (char *)mem_alloc(NULL, len+1);
    memcpy(str, buffer, len);
    return str;
}